

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath testing::internal::FilePath::MakeFileName
                   (FilePath *directory,FilePath *base_name,int number,char *extension)

{
  uint in_ECX;
  size_t extraout_RDX;
  String *in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  FilePath FVar1;
  String file;
  String *in_stack_ffffffffffffff60;
  String *in_stack_ffffffffffffff68;
  String *in_stack_ffffffffffffff70;
  char local_68 [24];
  FilePath *in_stack_ffffffffffffffb0;
  FilePath *in_stack_ffffffffffffffb8;
  String local_38;
  undefined8 local_28;
  uint local_1c;
  String *local_10;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_10 = in_RSI;
  String::String(&local_38);
  if (local_1c == 0) {
    in_stack_ffffffffffffff70 = (String *)c_str((FilePath *)0x1f9050);
    String::Format(&stack0xffffffffffffffb8,"%s.%s",in_stack_ffffffffffffff70,local_28);
    String::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    String::~String(in_stack_ffffffffffffff60);
  }
  else {
    in_stack_ffffffffffffff68 = (String *)c_str((FilePath *)0x1f90d6);
    String::Format(local_68,"%s_%d.%s",in_stack_ffffffffffffff68,(ulong)local_1c,local_28);
    String::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    String::~String(in_stack_ffffffffffffff60);
  }
  FilePath((FilePath *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ConcatPaths(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  ~FilePath((FilePath *)0x1f917b);
  String::~String(local_10);
  FVar1.pathname_.length_ = extraout_RDX;
  FVar1.pathname_.c_str_ = in_RDI;
  return (FilePath)FVar1.pathname_;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  String file;
  if (number == 0) {
    file = String::Format("%s.%s", base_name.c_str(), extension);
  } else {
    file = String::Format("%s_%d.%s", base_name.c_str(), number, extension);
  }
  return ConcatPaths(directory, FilePath(file));
}